

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&>
          (internal *this,basic_string_view<char> format_str,
          format_string_checker<char,_fmt::v5::internal::error_handler> *handler)

{
  parse_context_type *this_00;
  internal *piVar1;
  size_t *psVar2;
  internal iVar3;
  char *pcVar4;
  uint uVar5;
  format_string_checker<char,_fmt::v5::internal::error_handler> *in_RAX;
  internal *piVar6;
  format_string_checker<char,_fmt::v5::internal::error_handler> *pfVar7;
  char *begin;
  char *message;
  internal *end;
  id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
  local_38;
  
  pfVar7 = (format_string_checker<char,_fmt::v5::internal::error_handler> *)format_str.size_;
  if (format_str.data_ == (char *)0x0) {
    return;
  }
  end = (internal *)(format_str.data_ + (long)this);
  this_00 = &pfVar7->context_;
  message = "unmatched \'}\' in format string";
  local_38.handler = in_RAX;
  do {
    iVar3 = *this;
    piVar6 = this;
    while (iVar3 != (internal)0x7b) {
      piVar6 = piVar6 + 1;
      if (piVar6 == end) goto LAB_001cf777;
      iVar3 = *piVar6;
    }
    for (; this != piVar6; this = this + 2) {
      while (piVar1 = this + 1, *this != (internal)0x7d) {
        this = piVar1;
        if (piVar1 == piVar6) goto LAB_001cf6be;
      }
      if ((piVar1 == piVar6) || (*piVar1 != (internal)0x7d)) {
        error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
        break;
      }
    }
LAB_001cf6be:
    piVar6 = piVar6 + 1;
    if (piVar6 == end) {
      message = "invalid format string";
      goto LAB_001cf7b8;
    }
    if (*piVar6 != (internal)0x7b) {
      if (*piVar6 == (internal)0x7d) {
        uVar5 = (pfVar7->context_).next_arg_id_;
        if ((int)uVar5 < 0) {
          error_handler::on_error
                    ((error_handler *)this_00,
                     "cannot switch from manual to automatic argument indexing");
          uVar5 = 0;
        }
        else {
          (pfVar7->context_).next_arg_id_ = uVar5 + 1;
        }
        pfVar7->arg_id_ = uVar5;
        error_handler::on_error((error_handler *)this_00,"argument index out of range");
      }
      else {
        local_38.handler = pfVar7;
        piVar6 = (internal *)
                 parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&,char>>
                           ((char *)piVar6,(char *)end,&local_38);
        if (piVar6 == end) {
LAB_001cf7a8:
          message = "missing \'}\' in format string";
          goto LAB_001cf7b8;
        }
        if (*piVar6 != (internal)0x7d) {
          if (*piVar6 != (internal)0x3a) goto LAB_001cf7a8;
          piVar6 = piVar6 + 1;
          pcVar4 = (pfVar7->context_).format_str_.data_;
          (pfVar7->context_).format_str_.data_ = (char *)piVar6;
          psVar2 = &(pfVar7->context_).format_str_.size_;
          *psVar2 = (size_t)(pcVar4 + (*psVar2 - (long)piVar6));
          if ((piVar6 == end) || (*piVar6 != (internal)0x7d)) {
            message = "unknown format specifier";
            goto LAB_001cf7b8;
          }
        }
      }
    }
    this = piVar6 + 1;
    if (this == end) {
      return;
    }
  } while( true );
LAB_001cf777:
  while( true ) {
    while (piVar6 = this + 1, *this != (internal)0x7d) {
      this = piVar6;
      if (piVar6 == end) {
        return;
      }
    }
    if ((piVar6 == end) || (*piVar6 != (internal)0x7d)) break;
    this = this + 2;
    if (this == end) {
      return;
    }
  }
LAB_001cf7b8:
  error_handler::on_error((error_handler *)this_00,message);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}